

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzfmatrix.cpp
# Opt level: O1

int __thiscall
TPZFMatrix<double>::Decompose_LU
          (TPZFMatrix<double> *this,list<long,_std::allocator<long>_> *singular)

{
  size_t *psVar1;
  ulong uVar2;
  double *pdVar3;
  long lVar4;
  double *pdVar5;
  long lVar6;
  _List_node_base *p_Var7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  _List_node_base *p_Var11;
  long lVar12;
  int iVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  double extraout_XMM0_Qa;
  double dVar18;
  double extraout_XMM0_Qa_00;
  long local_a0;
  undefined8 local_38;
  
  if (1 < (byte)(this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed) {
    Error("Decompose_LU <Matrix already Decomposed with other scheme>",(char *)0x0);
  }
  if ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed == '\0') {
    uVar14 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
    uVar2 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol;
    uVar10 = uVar14;
    if ((long)uVar2 < (long)uVar14) {
      uVar10 = uVar2;
    }
    if (0 < (int)(uint)uVar10) {
      iVar13 = (int)uVar14;
      uVar17 = uVar14 & 0xffffffff;
      uVar15 = 1;
      lVar12 = 8;
      local_a0 = 0;
      p_Var11 = (_List_node_base *)0x0;
      do {
        (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
          [0x24])(this,p_Var11,p_Var11);
        dVar18 = extraout_XMM0_Qa;
        if (ABS(extraout_XMM0_Qa) < 1e-12) {
          p_Var7 = (_List_node_base *)operator_new(0x18);
          p_Var7[1]._M_next = p_Var11;
          std::__detail::_List_node_base::_M_hook(p_Var7);
          psVar1 = &(singular->super__List_base<long,_std::allocator<long>_>)._M_impl._M_node.
                    _M_size;
          *psVar1 = *psVar1 + 1;
          local_38 = 0x3ff0000000000000;
          (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
            [0x23])(this,p_Var11,p_Var11,&local_38);
          dVar18 = 1.0;
        }
        p_Var7 = (_List_node_base *)((long)&p_Var11->_M_next + 1);
        uVar16 = uVar15;
        if ((long)p_Var7 < (long)iVar13) {
          do {
            if (((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)uVar16) ||
               ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)p_Var11)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            lVar8 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow * local_a0;
            *(double *)((long)this->fElem + uVar16 * 8 + lVar8) =
                 *(double *)((long)this->fElem + uVar16 * 8 + lVar8) / dVar18;
            uVar16 = uVar16 + 1;
          } while (uVar17 != uVar16);
        }
        lVar8 = lVar12;
        uVar16 = uVar15;
        if ((long)p_Var7 < (long)(int)uVar2) {
          do {
            if (((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow <= (long)p_Var7) ||
               ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)uVar16)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar3 = this->fElem;
            lVar4 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            if ((lVar4 <= (long)p_Var7) ||
               ((this->super_TPZMatrix<double>).super_TPZBaseMatrix.fCol <= (long)p_Var11)) {
              Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
              pzinternal::DebugStopImpl
                        ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                         ,0x26d);
            }
            pdVar5 = this->fElem;
            lVar6 = (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fRow;
            (*(this->super_TPZMatrix<double>).super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable
              [0x24])(this,p_Var11,uVar16);
            if ((long)p_Var7 < (long)iVar13) {
              lVar4 = lVar4 * lVar8 + local_a0;
              lVar9 = 1;
              do {
                *(double *)((long)pdVar3 + lVar9 * 8 + lVar4) =
                     *(double *)((long)pdVar3 + lVar9 * 8 + lVar4) -
                     *(double *)((long)pdVar5 + lVar9 * 8 + (lVar6 + 1) * local_a0) *
                     extraout_XMM0_Qa_00;
                lVar9 = lVar9 + 1;
              } while ((int)uVar14 != (int)lVar9);
            }
            uVar16 = uVar16 + 1;
            lVar8 = lVar8 + 8;
          } while (uVar16 != (uVar2 & 0xffffffff));
        }
        uVar15 = uVar15 + 1;
        local_a0 = local_a0 + 8;
        lVar12 = lVar12 + 8;
        uVar14 = uVar14 - 1;
        p_Var11 = p_Var7;
      } while (p_Var7 != (_List_node_base *)(ulong)((uint)uVar10 & 0x7fffffff));
    }
    (this->super_TPZMatrix<double>).super_TPZBaseMatrix.fDecomposed = '\x01';
  }
  return 1;
}

Assistant:

int TPZFMatrix<TVar>::Decompose_LU(std::list<int64_t> &singular) {
    //return Decompose_LU();
#ifndef USING_LAPACK
    if (  this->fDecomposed && this->fDecomposed != ELU)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
#else
    if (  this->fDecomposed && this->fDecomposed != ELUPivot)  Error( "Decompose_LU <Matrix already Decomposed with other scheme>" );
#endif
    if (this->fDecomposed) return 1;
    
    const int  min = ( this->Cols() < (this->Rows()) ) ? this->Cols() : this->Rows();
    const int nrows = this->Rows();
    const int ncols = this->Cols();
    
    for ( int k = 0; k < min ; k++ ) {
        TVar pivot = GetVal(k, k);
        if (IsZero( pivot )){
            singular.push_back(k);
            PutVal(k,k,1.);
            pivot = 1.;
        }
        for ( int i = k+1; i < nrows; i++ ) {
            this->operator()(i,k) /= pivot;
        }
        for ( int j = k+1; j < ncols; j++ ){
            int i = k+1;
            TVar * elemPtr = &(this->operator()(i,j));
            TVar * ikPtr = &(this->operator()(i,k));
            const TVar kjVal = GetVal(k,j);
            for ( ; i < nrows; i++, elemPtr++, ikPtr++ ) {
                (*elemPtr) -= (*ikPtr)*kjVal;
                //          this->operator()(i,j) -= GetVal( i, k )*GetVal(k,j);
            }
        }
    }
    this->fDecomposed=ELU;
#ifdef USING_LAPACK
    fPivot.resize(nrows);
    for (int i=0; i<nrows; i++) {
        fPivot[i] = i+1;
    }
    this->fDecomposed = ELUPivot;
#endif //USING_LAPACK
    return 1;
}